

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MXF.cpp
# Opt level: O0

void __thiscall ASDCP::MXF::Preface::Preface(Preface *this,Dictionary *d)

{
  MDDEntry *value;
  uint local_4c;
  UL local_48;
  Dictionary *local_18;
  Dictionary *d_local;
  Preface *this_local;
  
  local_18 = d;
  d_local = (Dictionary *)this;
  InterchangeObject::InterchangeObject(&this->super_InterchangeObject,d);
  (this->super_InterchangeObject).super_KLVPacket._vptr_KLVPacket =
       (_func_int **)&PTR__Preface_00338e58;
  Kumu::Timestamp::Timestamp(&this->LastModifiedDate);
  this->Version = 0x102;
  optional_property<unsigned_int>::optional_property(&this->ObjectModelVersion);
  optional_property<Kumu::UUID>::optional_property(&this->PrimaryPackage);
  Array<Kumu::UUID>::Array(&this->Identifications);
  Kumu::UUID::UUID(&this->ContentStorage);
  UL::UL(&this->OperationalPattern);
  Batch<ASDCP::UL>::Batch(&this->EssenceContainers);
  Batch<ASDCP::UL>::Batch(&this->DMSchemes);
  optional_property<ASDCP::MXF::Batch<ASDCP::UL>_>::optional_property(&this->ApplicationSchemes);
  optional_property<ASDCP::MXF::Batch<ASDCP::UL>_>::optional_property
            (&this->ConformsToSpecifications);
  if ((this->super_InterchangeObject).m_Dict != (Dictionary *)0x0) {
    value = Dictionary::Type((this->super_InterchangeObject).m_Dict,MDD_Preface);
    UL::UL(&local_48,value->ul);
    UL::operator=(&(this->super_InterchangeObject).super_KLVPacket.m_UL,&local_48);
    UL::~UL(&local_48);
    local_4c = 0;
    optional_property<unsigned_int>::operator=(&this->ObjectModelVersion,&local_4c);
    return;
  }
  __assert_fail("m_Dict",
                "/workspace/llm4binary/github/license_c_cmakelists/cinecert[P]asdcplib/src/MXF.cpp",
                0x26a,"ASDCP::MXF::Preface::Preface(const Dictionary *)");
}

Assistant:

ASDCP::MXF::Preface::Preface(const Dictionary* d) :
  InterchangeObject(d), Version(258)
{
  assert(m_Dict);
  m_UL = m_Dict->Type(MDD_Preface).ul;
  ObjectModelVersion = 0;
}